

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::ConfidentialTransactionContext::AddPegoutTxOut
          (ConfidentialTransactionContext *this,Amount *value,ConfidentialAssetId *asset,
          BlockHash *genesisblock_hash,Address *btc_address,NetType bitcoin_net_type,
          Pubkey *online_pubkey,Privkey *master_online_key,string *btc_descriptor,
          uint32_t bip32_counter,ByteData *whitelist,NetType elements_net_type,
          Address *btc_derive_address)

{
  byte bVar1;
  uint32_t uVar2;
  Script *in_RCX;
  Script *in_RDX;
  ConfidentialAssetId *in_RSI;
  Amount *in_RDI;
  undefined4 in_R9D;
  Privkey *in_stack_00000008;
  string *in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_00000020;
  NetType in_stack_00000028;
  undefined4 in_stack_00000030;
  Address *in_stack_00000038;
  Script locking_script;
  Address derive_addr;
  PegoutKeyData key_data;
  Script script;
  undefined4 in_stack_fffffffffffffc6c;
  Script *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc7c;
  PegoutKeyData *in_stack_fffffffffffffc80;
  BlockHash local_330;
  Script local_2f8;
  Script local_2c0;
  string local_288 [32];
  Script local_268;
  Address local_220 [392];
  ByteData local_98 [2];
  Script local_68;
  undefined4 local_2c;
  Script *local_20;
  Script *local_18;
  ConfidentialAssetId *local_10;
  
  local_2c = in_R9D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  cfd::core::Script::Script(&local_68);
  core::PegoutKeyData::PegoutKeyData(in_stack_fffffffffffffc80);
  bVar1 = cfd::core::Pubkey::IsValid();
  if (((bVar1 & 1) == 0) || (bVar1 = cfd::core::Privkey::IsValid(), (bVar1 & 1) == 0)) {
    cfd::core::Address::GetLockingScript();
    cfd::core::Script::operator=(&local_68,&local_2f8);
    core::Script::~Script(in_stack_fffffffffffffc70);
  }
  else {
    cfd::core::Address::Address(local_220);
    cfd::core::ByteData::ByteData((ByteData *)&local_268);
    in_stack_fffffffffffffc70 = &local_268;
    cfd::core::ConfidentialTransaction::GetPegoutPubkeyData
              ((Pubkey *)
               ((long)&local_268.script_data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),in_stack_00000008,in_stack_00000010,
               in_stack_00000018,(ByteData *)(ulong)in_stack_00000020,in_stack_00000028,
               (ByteData *)CONCAT44(in_stack_fffffffffffffc6c,local_2c),
               (NetType)in_stack_fffffffffffffc70,
               (Address *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_00000030));
    core::PegoutKeyData::operator=
              ((PegoutKeyData *)in_stack_fffffffffffffc70,
               (PegoutKeyData *)CONCAT44(in_stack_fffffffffffffc6c,local_2c));
    core::PegoutKeyData::~PegoutKeyData((PegoutKeyData *)in_stack_fffffffffffffc70);
    core::ByteData::~ByteData((ByteData *)0x409a24);
    cfd::core::Address::GetAddress_abi_cxx11_();
    bVar1 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_288);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      cfd::core::Address::GetLockingScript();
      cfd::core::Script::operator=(&local_68,&local_2c0);
      core::Script::~Script(in_stack_fffffffffffffc70);
      if (in_stack_00000038 != (Address *)0x0) {
        cfd::core::Address::operator=(in_stack_00000038,local_220);
      }
    }
    core::Address::~Address((Address *)in_stack_fffffffffffffc70);
  }
  cfd::core::ScriptUtil::CreatePegoutLogkingScript(&local_330,local_20,(Pubkey *)&local_68,local_98)
  ;
  uVar2 = cfd::core::ConfidentialTransaction::AddTxOut(in_RDI,local_10,local_18);
  core::Script::~Script(in_stack_fffffffffffffc70);
  core::PegoutKeyData::~PegoutKeyData((PegoutKeyData *)in_stack_fffffffffffffc70);
  core::Script::~Script(in_stack_fffffffffffffc70);
  return uVar2;
}

Assistant:

uint32_t ConfidentialTransactionContext::AddPegoutTxOut(
    const Amount& value, const ConfidentialAssetId& asset,
    const BlockHash& genesisblock_hash, const Address& btc_address,
    NetType bitcoin_net_type, const Pubkey& online_pubkey,
    const Privkey& master_online_key, const std::string& btc_descriptor,
    uint32_t bip32_counter, const ByteData& whitelist,
    NetType elements_net_type, Address* btc_derive_address) {
  Script script;
  PegoutKeyData key_data;
  if (online_pubkey.IsValid() && master_online_key.IsValid()) {
    // generate pubkey and whitelistproof
    Address derive_addr;
    key_data = ConfidentialTransaction::GetPegoutPubkeyData(
        online_pubkey, master_online_key, btc_descriptor, bip32_counter,
        whitelist, bitcoin_net_type, ByteData(), elements_net_type,
        &derive_addr);
    if (!derive_addr.GetAddress().empty()) {
      script = derive_addr.GetLockingScript();
      if (btc_derive_address != nullptr) {
        *btc_derive_address = derive_addr;
      }
    }
  } else {
    script = btc_address.GetLockingScript();
  }

  Script locking_script = ScriptUtil::CreatePegoutLogkingScript(
      genesisblock_hash, script, key_data.btc_pubkey_bytes,
      key_data.whitelist_proof);
  return AddTxOut(value, asset, locking_script);
}